

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Articulated_Parts_PDU::Decode
          (Articulated_Parts_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  AttachedPart *pAVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  byte bVar6;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  *this_01;
  pointer pKVar7;
  KUINT8 paramTyp;
  byte local_59;
  KString local_58;
  KUINT8 *local_38;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (iVar5 + (uint)KVar3 < 0x11) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
    KException::KException(this_00,&local_58,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar7 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar7->_vptr_KRef_Ptr)(pKVar7);
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar2);
    (this->m_vVariableParameters).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  LE_Header::Decode(&this->super_LE_Header,stream,ignoreHeader);
  local_38 = &this->m_ui8NumOfVariableParams;
  KDataStream::Read(stream,local_38);
  if (this->m_ui8NumOfVariableParams != '\0') {
    this_01 = &this->m_vVariableParameters;
    bVar6 = 0;
    do {
      KVar3 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read(stream,&local_59);
      KDataStream::SetCurrentWritePosition(stream,KVar3);
      pAVar4 = (AttachedPart *)
               DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
                         ((uint)local_59,stream);
      if (pAVar4 == (AttachedPart *)0x0) {
        if (local_59 == 1) {
          pAVar4 = (AttachedPart *)operator_new(0x30);
          DATA_TYPE::AttachedPart::AttachedPart(pAVar4,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00223740;
          local_58._M_string_length = (size_type)pAVar4;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
        else if (local_59 == 0) {
          pAVar4 = (AttachedPart *)operator_new(0x28);
          DATA_TYPE::ArticulatedPart::ArticulatedPart((ArticulatedPart *)pAVar4,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00223740;
          local_58._M_string_length = (size_type)pAVar4;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
        else {
          pAVar4 = (AttachedPart *)operator_new(0x18);
          DATA_TYPE::VariableParameter::VariableParameter((VariableParameter *)pAVar4,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00223740;
          local_58._M_string_length = (size_type)pAVar4;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00223740;
        local_58._M_string_length = (size_type)pAVar4;
        local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      }
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00223740;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      bVar6 = bVar6 + 1;
    } while (bVar6 < *local_38);
  }
  return;
}

Assistant:

void Articulated_Parts_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ARTICULATED_PARTS_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vVariableParameters.clear();

    LE_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8NumOfVariableParams;

    for( KUINT8 i = 0; i < m_ui8NumOfVariableParams; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT8 paramTyp;

        // Extract the  type then reset the stream.
        stream >> paramTyp;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableParameter * p = VariableParameter::FactoryDecode( paramTyp, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableParameters.push_back( VarPrmPtr( p ) );
        }
        else
        {
            // Default internals
            switch( paramTyp )
            {
                case ArticulatedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new ArticulatedPart( stream ) ) );
                    break;

                case AttachedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new AttachedPart( stream ) ) );
                    break;

                default:
                    m_vVariableParameters.push_back( VarPrmPtr( new VariableParameter( stream ) ) );
                    break;
            }
        }
    }
}